

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::deviceMemoryProperties
          (TestStatus *__return_storage_ptr__,Context *context)

{
  uint *value;
  ostringstream *poVar1;
  ostringstream *this;
  TestLog *pTVar2;
  bool bVar3;
  InstanceInterface *pIVar4;
  VkPhysicalDevice pVVar5;
  TestStatus **ppTVar6;
  MessageBuilder *pMVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool requiredFlagsFound [1];
  TestStatus *local_580;
  VkMemoryPropertyFlags requiredPropertyFlags [1];
  uint local_574;
  Bitfield<32UL> local_570;
  MessageBuilder local_558;
  VkMemoryPropertyFlags validPropertyFlags [9];
  uint local_3b4 [87];
  deUint8 buffer [552];
  
  pTVar2 = context->m_testCtx->m_log;
  memset(buffer,0xcd,0x228);
  pIVar4 = Context::getInstanceInterface(context);
  pVVar5 = Context::getPhysicalDevice(context);
  (*pIVar4->_vptr_InstanceInterface[7])(pIVar4,pVVar5,buffer);
  this = (ostringstream *)(validPropertyFlags + 2);
  validPropertyFlags._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"device = ");
  Context::getPhysicalDevice(context);
  std::ostream::_M_insert<void_const*>(this);
  local_558.m_log =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)validPropertyFlags,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  poVar1 = &local_558.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  ::vk::operator<<((ostream *)poVar1,(VkPhysicalDeviceMemoryProperties *)buffer);
  tcu::MessageBuilder::operator<<(&local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  std::__cxx11::ostringstream::~ostringstream(this);
  for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
    if (buffer[lVar9 + 0x208] != 0xcd) {
      poVar1 = &local_558.m_str;
      local_558.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"deviceMemoryProperties - Guard offset ");
      std::ostream::operator<<(poVar1,(int)lVar9);
      std::operator<<((ostream *)poVar1," not valid");
      tcu::MessageBuilder::operator<<(&local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"deviceMemoryProperties buffer overflow",
                 (allocator<char> *)validPropertyFlags);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_558);
      goto LAB_004a0be9;
    }
  }
  if ((uint)buffer._260_4_ < 0x10) {
    if ((buffer._260_4_ == 1) && ((buffer[0x110] & 1) == 0)) {
      poVar1 = &local_558.m_str;
      local_558.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,
                      "deviceMemoryProperties - Single heap is not marked DEVICE_LOCAL");
      tcu::MessageBuilder::operator<<(&local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"deviceMemoryProperties invalid HeapFlags",
                 (allocator<char> *)validPropertyFlags);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_558);
    }
    else {
      validPropertyFlags[4] = 0xf;
      validPropertyFlags[5] = 6;
      validPropertyFlags[6] = 10;
      validPropertyFlags[7] = 0xe;
      validPropertyFlags[0] = 0;
      validPropertyFlags[1] = 1;
      validPropertyFlags[2] = 7;
      validPropertyFlags[3] = 0xb;
      validPropertyFlags[8] = 0x11;
      requiredPropertyFlags[0] = 6;
      for (lVar9 = 0; lVar9 != 1; lVar9 = lVar9 + 1) {
        requiredFlagsFound[lVar9] = false;
      }
      local_580 = __return_storage_ptr__;
      for (uVar8 = 0; uVar8 < (uint)buffer._0_4_; uVar8 = uVar8 + 1) {
        uVar10 = (ulong)uVar8;
        if ((uint)buffer._260_4_ <= *(uint *)(buffer + uVar10 * 8 + 8)) {
          poVar1 = &local_558.m_str;
          local_558.m_log = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,"deviceMemoryProperties - heapIndex ");
          pMVar7 = tcu::MessageBuilder::operator<<(&local_558,(uint *)(buffer + uVar10 * 8 + 8));
          std::operator<<((ostream *)&pMVar7->m_str," larger than heapCount");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_558,"deviceMemoryProperties - invalid heapIndex",
                     (allocator<char> *)&local_570);
          __return_storage_ptr__ = local_580;
          tcu::TestStatus::fail(local_580,(string *)&local_558);
          goto LAB_004a0be9;
        }
        value = (uint *)(buffer + uVar10 * 8 + 4);
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 4) {
          if ((*(uint *)((long)requiredPropertyFlags + lVar9) & ~*value) == 0) {
            requiredFlagsFound[0] = true;
          }
        }
        local_570.m_value = (deUint64)local_3b4;
        local_574 = *value & 0x1f;
        local_558.m_log = (TestLog *)validPropertyFlags;
        bVar3 = de::contains<unsigned_int_const*,unsigned_int>
                          ((uint **)&local_558,(uint **)&local_570,&local_574);
        if (!bVar3) {
          poVar1 = &local_558.m_str;
          local_558.m_log = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,"deviceMemoryProperties - propertyFlags ");
          pMVar7 = tcu::MessageBuilder::operator<<(&local_558,value);
          std::operator<<((ostream *)&pMVar7->m_str," not valid");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_558,"deviceMemoryProperties propertyFlags not valid",
                     (allocator<char> *)&local_570);
          __return_storage_ptr__ = local_580;
          tcu::TestStatus::fail(local_580,(string *)&local_558);
          goto LAB_004a0be9;
        }
        if ((*value & 1) == 0) {
          if ((*(uint *)(buffer + (ulong)*(uint *)(buffer + uVar10 * 8 + 8) * 0x10 + 0x110) & 1) !=
              0) {
            poVar1 = &local_558.m_str;
            local_558.m_log = pTVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            std::operator<<((ostream *)poVar1,
                            "deviceMemoryProperties - non-DEVICE_LOCAL memory type references heap with is DEVICE_LOCAL"
                           );
            tcu::MessageBuilder::operator<<(&local_558,(EndMessageToken *)&tcu::TestLog::EndMessage)
            ;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_558,
                       "deviceMemoryProperties inconsistent memoryType and HeapFlags",
                       (allocator<char> *)&local_570);
            __return_storage_ptr__ = local_580;
            tcu::TestStatus::fail(local_580,(string *)&local_558);
            goto LAB_004a0be9;
          }
        }
        else if ((*(uint *)(buffer + (ulong)*(uint *)(buffer + uVar10 * 8 + 8) * 0x10 + 0x110) & 1)
                 == 0) {
          poVar1 = &local_558.m_str;
          local_558.m_log = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,
                          "deviceMemoryProperties - DEVICE_LOCAL memory type references heap which is not DEVICE_LOCAL"
                         );
          tcu::MessageBuilder::operator<<(&local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_558,
                     "deviceMemoryProperties inconsistent memoryType and HeapFlags",
                     (allocator<char> *)&local_570);
          __return_storage_ptr__ = local_580;
          tcu::TestStatus::fail(local_580,(string *)&local_558);
          goto LAB_004a0be9;
        }
      }
      local_558.m_log = (TestLog *)((ulong)local_558.m_log & 0xffffffffffffff00);
      ppTVar6 = (TestStatus **)
                std::__find_if<bool*,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                          (requiredFlagsFound,&local_580);
      if (ppTVar6 == &local_580) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_558,"Querying memory properties succeeded",
                   (allocator<char> *)&local_570);
        __return_storage_ptr__ = local_580;
        tcu::TestStatus::pass(local_580,(string *)&local_558);
      }
      else {
        poVar1 = &local_558.m_str;
        local_558.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"deviceMemoryProperties - required property flags ");
        __return_storage_ptr__ = local_580;
        ::vk::getMemoryPropertyFlagsStr(&local_570,requiredPropertyFlags[0]);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_558,&local_570);
        std::operator<<((ostream *)&pMVar7->m_str," not found");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_558,"deviceMemoryProperties propertyFlags not valid",
                   (allocator<char> *)&local_570);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_558);
      }
    }
  }
  else {
    poVar1 = &local_558.m_str;
    local_558.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"deviceMemoryProperties - HeapCount larger than ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<(&local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"deviceMemoryProperties HeapCount too large",
               (allocator<char> *)validPropertyFlags);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_558);
  }
LAB_004a0be9:
  std::__cxx11::string::~string((string *)&local_558);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceMemoryProperties (Context& context)
{
	TestLog&							log			= context.getTestContext().getLog();
	VkPhysicalDeviceMemoryProperties*	memProps;
	deUint8								buffer[sizeof(VkPhysicalDeviceMemoryProperties) + GUARD_SIZE];

	memProps = reinterpret_cast<VkPhysicalDeviceMemoryProperties*>(buffer);
	deMemset(buffer, GUARD_VALUE, sizeof(buffer));

	context.getInstanceInterface().getPhysicalDeviceMemoryProperties(context.getPhysicalDevice(), memProps);

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage
		<< TestLog::Message << *memProps << TestLog::EndMessage;

	for (deInt32 ndx = 0; ndx < GUARD_SIZE; ndx++)
	{
		if (buffer[ndx + sizeof(VkPhysicalDeviceMemoryProperties)] != GUARD_VALUE)
		{
			log << TestLog::Message << "deviceMemoryProperties - Guard offset " << ndx << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties buffer overflow");
		}
	}

	if (memProps->memoryHeapCount >= VK_MAX_MEMORY_HEAPS)
	{
		log << TestLog::Message << "deviceMemoryProperties - HeapCount larger than " << (deUint32)VK_MAX_MEMORY_HEAPS << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceMemoryProperties HeapCount too large");
	}

	if (memProps->memoryHeapCount == 1)
	{
		if ((memProps->memoryHeaps[0].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) == 0)
		{
			log << TestLog::Message << "deviceMemoryProperties - Single heap is not marked DEVICE_LOCAL" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties invalid HeapFlags");
		}
	}

	const VkMemoryPropertyFlags validPropertyFlags[] =
	{
		0,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT,
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT,
		VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT
	};

	const VkMemoryPropertyFlags requiredPropertyFlags[] =
	{
		VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT
	};

	bool requiredFlagsFound[DE_LENGTH_OF_ARRAY(requiredPropertyFlags)];
	std::fill(DE_ARRAY_BEGIN(requiredFlagsFound), DE_ARRAY_END(requiredFlagsFound), false);

	for (deUint32 memoryNdx = 0; memoryNdx < memProps->memoryTypeCount; memoryNdx++)
	{
		bool validPropTypeFound = false;

		if (memProps->memoryTypes[memoryNdx].heapIndex >= memProps->memoryHeapCount)
		{
			log << TestLog::Message << "deviceMemoryProperties - heapIndex " << memProps->memoryTypes[memoryNdx].heapIndex << " larger than heapCount" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties - invalid heapIndex");
		}

		const VkMemoryPropertyFlags bitsToCheck = VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT|VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT|VK_MEMORY_PROPERTY_HOST_COHERENT_BIT|VK_MEMORY_PROPERTY_HOST_CACHED_BIT|VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT;

		for (const VkMemoryPropertyFlags* requiredFlagsIterator = DE_ARRAY_BEGIN(requiredPropertyFlags); requiredFlagsIterator != DE_ARRAY_END(requiredPropertyFlags); requiredFlagsIterator++)
			if ((memProps->memoryTypes[memoryNdx].propertyFlags & *requiredFlagsIterator) == *requiredFlagsIterator)
				requiredFlagsFound[requiredFlagsIterator - DE_ARRAY_BEGIN(requiredPropertyFlags)] = true;

		if (de::contains(DE_ARRAY_BEGIN(validPropertyFlags), DE_ARRAY_END(validPropertyFlags), memProps->memoryTypes[memoryNdx].propertyFlags & bitsToCheck))
			validPropTypeFound = true;

		if (!validPropTypeFound)
		{
			log << TestLog::Message << "deviceMemoryProperties - propertyFlags "
				<< memProps->memoryTypes[memoryNdx].propertyFlags << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceMemoryProperties propertyFlags not valid");
		}

		if (memProps->memoryTypes[memoryNdx].propertyFlags & VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT)
		{
			if ((memProps->memoryHeaps[memProps->memoryTypes[memoryNdx].heapIndex].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) == 0)
			{
				log << TestLog::Message << "deviceMemoryProperties - DEVICE_LOCAL memory type references heap which is not DEVICE_LOCAL" << TestLog::EndMessage;
				return tcu::TestStatus::fail("deviceMemoryProperties inconsistent memoryType and HeapFlags");
			}
		}
		else
		{
			if (memProps->memoryHeaps[memProps->memoryTypes[memoryNdx].heapIndex].flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT)
			{
				log << TestLog::Message << "deviceMemoryProperties - non-DEVICE_LOCAL memory type references heap with is DEVICE_LOCAL" << TestLog::EndMessage;
				return tcu::TestStatus::fail("deviceMemoryProperties inconsistent memoryType and HeapFlags");
			}
		}
	}

	bool* requiredFlagsFoundIterator = std::find(DE_ARRAY_BEGIN(requiredFlagsFound), DE_ARRAY_END(requiredFlagsFound), false);
	if (requiredFlagsFoundIterator != DE_ARRAY_END(requiredFlagsFound))
	{
		DE_ASSERT(requiredFlagsFoundIterator - DE_ARRAY_BEGIN(requiredFlagsFound) <= DE_LENGTH_OF_ARRAY(requiredPropertyFlags));
		log << TestLog::Message << "deviceMemoryProperties - required property flags "
			<< getMemoryPropertyFlagsStr(requiredPropertyFlags[requiredFlagsFoundIterator - DE_ARRAY_BEGIN(requiredFlagsFound)]) << " not found" << TestLog::EndMessage;

		return tcu::TestStatus::fail("deviceMemoryProperties propertyFlags not valid");
	}

	return tcu::TestStatus::pass("Querying memory properties succeeded");
}